

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IpxWrapper.cpp
# Opt level: O2

bool illegalIpxStoppedCrossoverStatus(Info *ipx_info,HighsOptions *options)

{
  int iVar1;
  bool status_error;
  allocator local_121;
  string local_120;
  string local_100;
  string local_e0;
  string local_c0;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  iVar1 = (ipx_info->super_ipx_info).status_crossover;
  std::__cxx11::string::string
            ((string *)&local_40,"stopped status_crossover should not be IPX_STATUS_optimal",
             &local_121);
  ipxStatusError(iVar1 == 1,options,&local_40,-1);
  std::__cxx11::string::~string((string *)&local_40);
  status_error = true;
  if (iVar1 != 1) {
    iVar1 = (ipx_info->super_ipx_info).status_crossover;
    std::__cxx11::string::string
              ((string *)&local_60,"stopped status_crossover should not be IPX_STATUS_imprecise",
               &local_121);
    ipxStatusError(iVar1 == 2,options,&local_60,-1);
    std::__cxx11::string::~string((string *)&local_60);
    if (iVar1 != 2) {
      iVar1 = (ipx_info->super_ipx_info).status_crossover;
      std::__cxx11::string::string
                ((string *)&local_80,
                 "stopped status_crossover should not be IPX_STATUS_primal_infeas",&local_121);
      ipxStatusError(iVar1 == 3,options,&local_80,-1);
      std::__cxx11::string::~string((string *)&local_80);
      if (iVar1 != 3) {
        iVar1 = (ipx_info->super_ipx_info).status_crossover;
        std::__cxx11::string::string
                  ((string *)&local_a0,
                   "stopped status_crossover should not be IPX_STATUS_dual_infeas",&local_121);
        ipxStatusError(iVar1 == 4,options,&local_a0,-1);
        std::__cxx11::string::~string((string *)&local_a0);
        if (iVar1 != 4) {
          iVar1 = (ipx_info->super_ipx_info).status_crossover;
          std::__cxx11::string::string
                    ((string *)&local_c0,
                     "stopped status_crossover should not be IPX_STATUS_iter_limit",&local_121);
          ipxStatusError(iVar1 == 7,options,&local_c0,-1);
          std::__cxx11::string::~string((string *)&local_c0);
          if (iVar1 != 7) {
            iVar1 = (ipx_info->super_ipx_info).status_crossover;
            std::__cxx11::string::string
                      ((string *)&local_e0,
                       "stopped status_crossover should not be IPX_STATUS_no_progress",&local_121);
            ipxStatusError(iVar1 == 8,options,&local_e0,-1);
            std::__cxx11::string::~string((string *)&local_e0);
            if (iVar1 != 8) {
              iVar1 = (ipx_info->super_ipx_info).status_crossover;
              std::__cxx11::string::string
                        ((string *)&local_100,
                         "stopped status_crossover should not be IPX_STATUS_failed",&local_121);
              ipxStatusError(iVar1 == 9,options,&local_100,-1);
              std::__cxx11::string::~string((string *)&local_100);
              if (iVar1 != 9) {
                iVar1 = (ipx_info->super_ipx_info).status_crossover;
                std::__cxx11::string::string
                          ((string *)&local_120,
                           "stopped status_crossover should not be IPX_STATUS_debug",&local_121);
                status_error = iVar1 == 10;
                ipxStatusError(status_error,options,&local_120,-1);
                std::__cxx11::string::~string((string *)&local_120);
              }
            }
          }
        }
      }
    }
  }
  return status_error;
}

Assistant:

bool illegalIpxStoppedCrossoverStatus(const ipx::Info& ipx_info,
                                      const HighsOptions& options) {
  bool found_illegal_status = false;
  // Cannot stop and be optimal
  found_illegal_status =
      found_illegal_status ||
      ipxStatusError(
          ipx_info.status_crossover == IPX_STATUS_optimal, options,
          "stopped status_crossover should not be IPX_STATUS_optimal");
  // Cannot stop and be imprecise
  found_illegal_status =
      found_illegal_status ||
      ipxStatusError(
          ipx_info.status_crossover == IPX_STATUS_imprecise, options,
          "stopped status_crossover should not be IPX_STATUS_imprecise");
  // Cannot stop with primal infeasibility
  found_illegal_status =
      found_illegal_status ||
      ipxStatusError(
          ipx_info.status_crossover == IPX_STATUS_primal_infeas, options,
          "stopped status_crossover should not be IPX_STATUS_primal_infeas");
  // Cannot stop with dual infeasibility
  found_illegal_status =
      found_illegal_status ||
      ipxStatusError(
          ipx_info.status_crossover == IPX_STATUS_dual_infeas, options,
          "stopped status_crossover should not be IPX_STATUS_dual_infeas");
  // Cannot stop and reach iteration limit
  found_illegal_status =
      found_illegal_status ||
      ipxStatusError(
          ipx_info.status_crossover == IPX_STATUS_iter_limit, options,
          "stopped status_crossover should not be IPX_STATUS_iter_limit");
  // Can stop and reach time limit
  // Cannot stop with no_progress
  found_illegal_status =
      found_illegal_status ||
      ipxStatusError(
          ipx_info.status_crossover == IPX_STATUS_no_progress, options,
          "stopped status_crossover should not be IPX_STATUS_no_progress");
  // Cannot stop and failed - should be error return earlier
  found_illegal_status =
      found_illegal_status ||
      ipxStatusError(
          ipx_info.status_crossover == IPX_STATUS_failed, options,
          "stopped status_crossover should not be IPX_STATUS_failed");
  // Cannot stop and debug - should be error return earlier
  found_illegal_status =
      found_illegal_status ||
      ipxStatusError(ipx_info.status_crossover == IPX_STATUS_debug, options,
                     "stopped status_crossover should not be IPX_STATUS_debug");
  return found_illegal_status;
}